

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1900.c
# Opt level: O1

void setup_handle(char *base_url,CURLM *m,int handlenum)

{
  char urlbuf [256];
  undefined1 auStack_128 [264];
  
  curl_msnprintf(auStack_128,0x100,"%s%s",base_url,urlstring[handlenum]);
  curl_easy_setopt(handles[handlenum],0x2712,auStack_128);
  curl_easy_setopt(handles[handlenum],0x29,1);
  curl_easy_setopt(handles[handlenum],0x2d,1);
  curl_easy_setopt(handles[handlenum],0x4e2b,write_callback);
  curl_easy_setopt(handles[handlenum],0x2711,0);
  curl_multi_add_handle(m,handles[handlenum]);
  return;
}

Assistant:

static void setup_handle(char *base_url, CURLM *m, int handlenum)
{
  char urlbuf[256];

  snprintf(urlbuf, sizeof(urlbuf), "%s%s", base_url, urlstring[handlenum]);
  curl_easy_setopt(handles[handlenum], CURLOPT_URL, urlbuf);
  curl_easy_setopt(handles[handlenum], CURLOPT_VERBOSE, 1L);
  curl_easy_setopt(handles[handlenum], CURLOPT_FAILONERROR, 1L);
  curl_easy_setopt(handles[handlenum], CURLOPT_WRITEFUNCTION, write_callback);
  curl_easy_setopt(handles[handlenum], CURLOPT_WRITEDATA, NULL);
  curl_multi_add_handle(m, handles[handlenum]);
}